

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_adapt.c
# Opt level: O0

int arkAdapt(void *arkode_mem,ARKodeHAdaptMem hadapt_mem,N_Vector ycur,realtype tcur,realtype hcur,
            realtype dsm,long nst)

{
  ARKodeHAdaptMem in_RCX;
  ARKodeHAdaptMem hadapt_mem_00;
  realtype in_RDX;
  double *in_RSI;
  ARKodeMem in_RDI;
  realtype *in_XMM0_Qa;
  double dVar1;
  double dVar2;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  ARKodeHAdaptMem unaff_retaddr;
  ARKodeMem ark_mem;
  realtype int_dir;
  realtype h_cfl;
  realtype h_acc;
  realtype ecur;
  int k;
  int ier;
  double local_c0;
  double local_b8;
  double local_b0;
  realtype *in_stack_ffffffffffffff60;
  realtype in_stack_ffffffffffffff68;
  realtype in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 uVar3;
  realtype *in_stack_ffffffffffffff98;
  ARKodeHAdaptMem in_stack_ffffffffffffffa0;
  double in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffbc;
  int in_stack_fffffffffffffffc;
  int iVar4;
  
  if (in_RDI == (ARKodeMem)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,"ARKode","arkAdapt","arkode_mem = NULL illegal.");
    iVar4 = -0x15;
  }
  else {
    dVar1 = in_RSI[0xf] * in_XMM2_Qa;
    if (*(int *)(in_RSI + 0x17) == 0) {
      uVar3 = *(undefined4 *)((long)in_RSI + 0xb4);
    }
    else {
      uVar3 = *(undefined4 *)(in_RSI + 0x16);
    }
    hadapt_mem_00 = (ARKodeHAdaptMem)(ulong)(*(int *)(in_RSI + 0xc) + 1);
    switch(hadapt_mem_00) {
    case (ARKodeHAdaptMem)0x0:
      iVar4 = (*(code *)in_RSI[6])
                        (in_XMM0_Qa,in_XMM1_Qa,in_RSI[10],SUB84(in_RSI[0xb],0),dVar1,in_RSI[8],
                         in_RSI[9],in_RDX,*(undefined4 *)(in_RSI + 0x16),
                         *(undefined4 *)((long)in_RSI + 0xb4),&stack0xffffffffffffffa8,in_RSI[7]);
      break;
    case (ARKodeHAdaptMem)0x1:
      iVar4 = arkAdaptPID(in_RCX,in_stack_ffffffffffffffbc,dVar1,in_stack_ffffffffffffffa8,
                          &in_stack_ffffffffffffffa0->etamax);
      break;
    case (ARKodeHAdaptMem)0x2:
      iVar4 = arkAdaptPI(in_stack_ffffffffffffffa0,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                         (realtype)in_RDI,(realtype)CONCAT44(uVar3,in_stack_ffffffffffffff88),
                         (realtype *)hadapt_mem_00);
      break;
    case (ARKodeHAdaptMem)0x3:
      iVar4 = arkAdaptI(hadapt_mem_00,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                        in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                        in_stack_ffffffffffffff60);
      break;
    case (ARKodeHAdaptMem)0x4:
      iVar4 = arkAdaptExpGus(in_RCX,in_stack_ffffffffffffffbc,(long)dVar1,in_stack_ffffffffffffffa8,
                             (realtype)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      break;
    case (ARKodeHAdaptMem)0x5:
      iVar4 = arkAdaptImpGus(in_RCX,in_stack_ffffffffffffffbc,(long)dVar1,in_stack_ffffffffffffffa8,
                             (realtype)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      break;
    case (ARKodeHAdaptMem)0x6:
      iVar4 = arkAdaptImExGus(unaff_retaddr,in_stack_fffffffffffffffc,(long)in_RDI,(realtype)in_RSI,
                              in_RDX,in_XMM0_Qa);
      break;
    default:
      arkProcessError(in_RDI,-0x16,"ARKode","arkAdapt","Illegal imethod.");
      return -0x16;
    }
    if (iVar4 == 0) {
      dVar2 = in_XMM1_Qa / ABS(in_XMM1_Qa);
      iVar4 = (*(code *)in_RSI[0x18])(in_XMM0_Qa,in_RDX,&stack0xffffffffffffffa0,in_RSI[0x19]);
      if (iVar4 == 0) {
        if ((double)in_stack_ffffffffffffffa0 <= 0.0) {
          in_stack_ffffffffffffffa0 = (ARKodeHAdaptMem)(ABS(in_XMM1_Qa) * 1e+30);
        }
        if (in_RDI->report != 0) {
          fprintf((FILE *)in_RDI->diagfp,
                  "ARKadapt  adapt  %.16g  %.16g  %.16g  %.16g  %.16g  %.16g  %.16g  %.16g  ",dVar1,
                  in_RSI[8],in_RSI[9],SUB84(in_XMM1_Qa,0),in_RSI[10],in_RSI[0xb],
                  in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
        }
        dVar1 = in_RSI[0xe] * in_stack_ffffffffffffffa8;
        local_b0 = in_RSI[0xd] * dVar2 * (double)in_stack_ffffffffffffffa0;
        if (ABS(*in_RSI * in_XMM1_Qa) <= ABS(dVar1)) {
          dVar1 = *in_RSI * in_XMM1_Qa;
        }
        dVar1 = dVar2 * ABS(dVar1);
        if (ABS(dVar1) <= ABS(in_RSI[3] * in_XMM1_Qa)) {
          dVar1 = in_RSI[3] * in_XMM1_Qa;
        }
        dVar1 = dVar2 * ABS(dVar1);
        if (in_RDI->report != 0) {
          fprintf((FILE *)in_RDI->diagfp,"%.16g  %.16g  ",dVar1,local_b0);
        }
        if (ABS(local_b0) <= ABS(dVar1)) {
          in_RSI[0x1b] = (double)((long)in_RSI[0x1b] + 1);
        }
        else {
          in_RSI[0x1a] = (double)((long)in_RSI[0x1a] + 1);
        }
        if (ABS(dVar1) < ABS(local_b0)) {
          local_b0 = dVar1;
        }
        local_b0 = ABS(local_b0);
        dVar2 = dVar2 * local_b0;
        if (((in_XMM2_Qa <= 1.0) && (ABS(in_XMM1_Qa * in_RSI[0x11] * 0.999999) < ABS(dVar2))) &&
           (ABS(dVar2) < ABS(in_XMM1_Qa * in_RSI[0x12] * 1.000001))) {
          dVar2 = in_XMM1_Qa;
        }
        in_RDI->eta = dVar2 / in_XMM1_Qa;
        if (in_RDI->eta <= in_RDI->hmin / ABS(in_XMM1_Qa)) {
          local_b8 = in_RDI->hmin / ABS(in_XMM1_Qa);
        }
        else {
          local_b8 = in_RDI->eta;
        }
        in_RDI->eta = local_b8;
        if (1.0 <= ABS(in_XMM1_Qa) * in_RDI->hmax_inv * in_RDI->eta) {
          local_c0 = ABS(in_XMM1_Qa) * in_RDI->hmax_inv * in_RDI->eta;
        }
        else {
          local_c0 = 1.0;
        }
        in_RDI->eta = in_RDI->eta / local_c0;
        if (in_RDI->report != 0) {
          fprintf((FILE *)in_RDI->diagfp,"%.16g\n",in_RDI->eta);
        }
      }
      else {
        arkProcessError(in_RDI,-0x16,"ARKode","arkAdapt","Error in explicit stability function.");
        iVar4 = -0x16;
      }
    }
    else {
      arkProcessError(in_RDI,-0x16,"ARKode","arkAdapt",
                      "Error in accuracy-based adaptivity function.");
      iVar4 = -0x16;
    }
  }
  return iVar4;
}

Assistant:

int arkAdapt(void* arkode_mem, ARKodeHAdaptMem hadapt_mem,
             N_Vector ycur, realtype tcur, realtype hcur,
             realtype dsm, long int nst)
{
  int ier, k;
  realtype ecur, h_acc, h_cfl, int_dir;
  ARKodeMem ark_mem;
  if (arkode_mem == NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode",
                    "arkAdapt", MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem) arkode_mem;

  /* Current error with bias factor */
  ecur = hadapt_mem->bias * dsm;

  /* Set k as either p or q, based on pq flag */
  k = (hadapt_mem->pq) ? hadapt_mem->q : hadapt_mem->p;

  /* Call algorithm-specific error adaptivity method */
  switch (hadapt_mem->imethod) {
  case(ARK_ADAPT_PID):         /* PID controller */
    ier = arkAdaptPID(hadapt_mem, k, hcur, ecur, &h_acc);
    break;
  case(ARK_ADAPT_PI):          /* PI controller */
    ier = arkAdaptPI(hadapt_mem, k, hcur, ecur, &h_acc);
    break;
  case(ARK_ADAPT_I):           /* I controller */
    ier = arkAdaptI(hadapt_mem, k, hcur, ecur, &h_acc);
    break;
  case(ARK_ADAPT_EXP_GUS):     /* explicit Gustafsson controller */
    ier = arkAdaptExpGus(hadapt_mem, k, nst, hcur, ecur, &h_acc);
    break;
  case(ARK_ADAPT_IMP_GUS):     /* implicit Gustafsson controller */
    ier = arkAdaptImpGus(hadapt_mem, k, nst, hcur, ecur, &h_acc);
    break;
  case(ARK_ADAPT_IMEX_GUS):    /* imex Gustafsson controller */
    ier = arkAdaptImExGus(hadapt_mem, k, nst, hcur, ecur, &h_acc);
    break;
  case(ARK_ADAPT_CUSTOM):      /* user-supplied controller */
    ier = hadapt_mem->HAdapt(ycur, tcur, hcur, hadapt_mem->hhist[0],
                             hadapt_mem->hhist[1], ecur,
                             hadapt_mem->ehist[0],
                             hadapt_mem->ehist[1],
                             hadapt_mem->q, hadapt_mem->p,
                             &h_acc, hadapt_mem->HAdapt_data);
    break;
  default:
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode", "arkAdapt",
                    "Illegal imethod.");
    return (ARK_ILL_INPUT);
  }
  if (ier != ARK_SUCCESS) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode", "arkAdapt",
                    "Error in accuracy-based adaptivity function.");
    return (ARK_ILL_INPUT);
  }

  /* determine direction of integration */
  int_dir = hcur / SUNRabs(hcur);

  /* Call explicit stability function */
  ier = hadapt_mem->expstab(ycur, tcur, &h_cfl, hadapt_mem->estab_data);
  if (ier != ARK_SUCCESS) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode", "arkAdapt",
                    "Error in explicit stability function.");
    return (ARK_ILL_INPUT);
  }
  if (h_cfl <= ZERO)  h_cfl = RCONST(1.0e30) * SUNRabs(hcur);

  /* Solver diagnostics reporting */
  if (ark_mem->report)
    fprintf(ark_mem->diagfp, "ARKadapt  adapt  %"RSYM"  %"RSYM"  %"RSYM"  %"RSYM"  %"RSYM"  %"RSYM"  %"RSYM"  %"RSYM"  ",
            ecur, hadapt_mem->ehist[0], hadapt_mem->ehist[1],
            hcur, hadapt_mem->hhist[0], hadapt_mem->hhist[1], h_acc, h_cfl);

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
  SUNLogger_QueueMsg(ARK_LOGGER, SUN_LOGLEVEL_INFO,
                     "ARKODE::arkAdapt", "error-history",
                     "ecur = %"RSYM", ehist[0] = %"RSYM", ehist[0] = %"RSYM,
                     ecur, hadapt_mem->ehist[0], hadapt_mem->ehist[1]);

  SUNLogger_QueueMsg(ARK_LOGGER, SUN_LOGLEVEL_INFO,
                     "ARKODE::arkAdapt", "step-history",
                     "hcur = %"RSYM", hhist[0] = %"RSYM", hhist[0] = %"RSYM,
                     hcur, hadapt_mem->hhist[0], hadapt_mem->hhist[1]);

  SUNLogger_QueueMsg(ARK_LOGGER, SUN_LOGLEVEL_INFO,
                     "ARKODE::arkAdapt", "new-step-before-bounds",
                     "h_acc = %"RSYM", h_cfl = %"RSYM, h_acc, h_cfl);
#endif

  /* enforce safety factors */
  h_acc *= hadapt_mem->safety;
  h_cfl *= hadapt_mem->cfl * int_dir;

  /* enforce maximum bound on time step growth */
  h_acc = int_dir * SUNMIN(SUNRabs(h_acc), SUNRabs(hadapt_mem->etamax*hcur));

  /* enforce minimum bound time step reduction */
  h_acc = int_dir * SUNMAX(SUNRabs(h_acc), SUNRabs(hadapt_mem->etamin*hcur));

  /* Solver diagnostics reporting */
  if (ark_mem->report)
    fprintf(ark_mem->diagfp, "%"RSYM"  %"RSYM"  ", h_acc, h_cfl);

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
  SUNLogger_QueueMsg(ARK_LOGGER, SUN_LOGLEVEL_INFO,
                     "ARKODE::arkAdapt", "new-step-after-max-min-bounds",
                     "h_acc = %"RSYM", h_cfl = %"RSYM, h_acc, h_cfl);
#endif

  /* increment the relevant step counter, set desired step */
  if (SUNRabs(h_acc) < SUNRabs(h_cfl))
    hadapt_mem->nst_acc++;
  else
    hadapt_mem->nst_exp++;
  h_acc = int_dir * SUNMIN(SUNRabs(h_acc), SUNRabs(h_cfl));

  /* enforce adaptivity bounds to retain Jacobian/preconditioner accuracy */
  if (dsm <= ONE) {
    if ( (SUNRabs(h_acc) > SUNRabs(hcur*hadapt_mem->lbound*ONEMSM)) &&
         (SUNRabs(h_acc) < SUNRabs(hcur*hadapt_mem->ubound*ONEPSM)) )
      h_acc = hcur;
  }

  /* set basic value of ark_eta */
  ark_mem->eta = h_acc / hcur;

  /* enforce minimum time step size */
  ark_mem->eta = SUNMAX(ark_mem->eta,
                        ark_mem->hmin / SUNRabs(hcur));

  /* enforce maximum time step size */
  ark_mem->eta /= SUNMAX(ONE, SUNRabs(hcur) *
                         ark_mem->hmax_inv*ark_mem->eta);

  /* Solver diagnostics reporting */
  if (ark_mem->report)
    fprintf(ark_mem->diagfp, "%"RSYM"\n", ark_mem->eta);

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
  SUNLogger_QueueMsg(ARK_LOGGER, SUN_LOGLEVEL_INFO, "ARKODE::arkAdapt",
                     "new-step-eta", "eta = %"RSYM, ark_mem->eta);
#endif

  return(ier);
}